

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extprivkey.cpp
# Opt level: O0

void __thiscall ExtPrivkey_DerivePrivkeyTest_Test::TestBody(ExtPrivkey_DerivePrivkeyTest_Test *this)

{
  initializer_list<unsigned_int> __l;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_1170;
  Message local_1168;
  Extkey local_1160;
  string local_10d0;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar_23;
  Message local_1098;
  string local_1090;
  undefined1 local_1070 [8];
  AssertionResult gtest_ar_22;
  KeyData data2;
  Message local_ed0;
  Extkey local_ec8;
  string local_e38;
  undefined1 local_e18 [8];
  AssertionResult gtest_ar_21;
  Message local_e00;
  string local_df8;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar_20;
  string local_dc0;
  undefined1 local_da0 [8];
  KeyData data1;
  Message local_c10 [2];
  CfdException *anon_var_0;
  string local_bf8;
  ExtPrivkey local_bd8;
  byte local_b41;
  char *pcStack_b40;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_b30;
  uint32_t local_b28;
  uint32_t local_b24;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar_19;
  Message local_b08;
  uint8_t local_afa;
  uint8_t local_af9;
  undefined1 local_af8 [8];
  AssertionResult gtest_ar_18;
  Message local_ae0;
  uint32_t local_ad8;
  uint32_t local_ad4;
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar_17;
  AssertHelper local_aa0;
  Message local_a98;
  bool local_a89;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar__3;
  Message local_a70;
  string local_a68;
  string local_a48;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar_16;
  Message local_a10;
  ByteData local_a08;
  string local_9f0;
  ByteData local_9d0;
  string local_9b8;
  undefined1 local_998 [8];
  AssertionResult gtest_ar_15;
  string local_980;
  ExtPrivkey local_960;
  AssertHelper local_8d0;
  Message local_8c8;
  uint32_t local_8c0;
  uint32_t local_8bc;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_14;
  Message local_8a0;
  uint8_t local_892;
  uint8_t local_891;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_13;
  Message local_878;
  uint32_t local_870;
  uint32_t local_86c;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_838;
  Message local_830;
  bool local_821;
  undefined1 local_820 [8];
  AssertionResult gtest_ar__2;
  Message local_808;
  string local_800;
  string local_7e0;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_11;
  Message local_7a8;
  ByteData local_7a0;
  string local_788;
  ByteData local_768;
  string local_750;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_690;
  Message local_688;
  uint32_t local_680;
  uint local_67c;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_9;
  Message local_660;
  uint8_t local_655;
  int local_654;
  undefined1 local_650 [8];
  AssertionResult gtest_ar_8;
  Message local_638;
  uint32_t local_62c;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_5f8;
  Message local_5f0;
  bool local_5e1;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar__1;
  Message local_5c8;
  string local_5c0;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_6;
  Message local_588;
  ByteData local_580;
  string local_568;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_4a8;
  Message local_4a0;
  uint32_t local_498 [2];
  undefined1 local_490 [8];
  AssertionResult gtest_ar_4;
  Message local_478;
  uint8_t local_46d;
  int local_46c;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_3;
  Message local_450;
  uint32_t local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_410;
  Message local_408;
  bool local_3f9;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_;
  Message local_3e0;
  string local_3d8;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_1;
  Message local_3a0;
  ByteData local_398;
  string local_380;
  undefined1 local_360 [8];
  AssertionResult gtest_ar;
  allocator<unsigned_int> local_2b9;
  uint local_2b8 [2];
  iterator local_2b0;
  size_type local_2a8;
  undefined1 local_2a0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ExtPrivkey child2;
  ExtPrivkey child1;
  ExtPrivkey child;
  ExtPrivkey extkey;
  allocator local_31;
  undefined1 local_30 [8];
  string ext_base58;
  ExtPrivkey_DerivePrivkeyTest_Test *this_local;
  
  ext_base58.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ExtPrivkey::ExtPrivkey
            ((ExtPrivkey *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),(string *)local_30);
  cfd::core::ExtPrivkey::ExtPrivkey
            ((ExtPrivkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ExtPrivkey::ExtPrivkey
            ((ExtPrivkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ExtPrivkey::ExtPrivkey
            ((ExtPrivkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2b8[0] = 0;
  local_2b8[1] = 0x2c;
  local_2b0 = local_2b8;
  local_2a8 = 2;
  std::allocator<unsigned_int>::allocator(&local_2b9);
  __l._M_len = local_2a8;
  __l._M_array = local_2b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0,__l,&local_2b9);
  std::allocator<unsigned_int>::~allocator(&local_2b9);
  cfd::core::ExtPrivkey::DerivePrivkey
            ((ExtPrivkey *)&gtest_ar.message_,
             (ExtPrivkey *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0);
  cfd::core::ExtPrivkey::operator=
            ((ExtPrivkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),(ExtPrivkey *)&gtest_ar.message_);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&gtest_ar.message_);
  cfd::core::Extkey::GetData
            (&local_398,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_380,&local_398);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_360,
             "\"0488ade40691fe4d290000002c368a8a370cc1f3e76cba08f13542e0dfb4e77dd08e8c70353f357a32b90be9d00005c52ec06dee7aa3249d9f8f3b930709967a43001fc8b9889eb22a850438ecc9\""
             ,"child.GetData().GetHex().c_str()",
             "0488ade40691fe4d290000002c368a8a370cc1f3e76cba08f13542e0dfb4e77dd08e8c70353f357a32b90be9d00005c52ec06dee7aa3249d9f8f3b930709967a43001fc8b9889eb22a850438ecc9"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_380);
  cfd::core::ByteData::~ByteData(&local_398);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_3d8,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3b8,
             "\"xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN\""
             ,"child.ToString().c_str()",
             "xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_3f9 = cfd::core::ExtPrivkey::IsValid
                        ((ExtPrivkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f8,&local_3f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_3f8,
               (AssertionResult *)"child.IsValid()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  local_444 = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_440,"extprivkey_kVersionMainnetPrivkey","child.GetVersion()",
             &extprivkey_kVersionMainnetPrivkey,&local_444);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_46c = 6;
  local_46d = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_468,"6","child.GetDepth()",&local_46c,&local_46d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  local_498[1] = 0x2c;
  local_498[0] = cfd::core::Extkey::GetChildNum
                           ((Extkey *)
                            ((long)&child1.super_Extkey.tweak_sum_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_490,"44","child.GetChildNum()",(int *)(local_498 + 1),
             local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  cfd::core::ExtPrivkey::DerivePrivkey
            ((ExtPrivkey *)&gtest_ar_5.message_,
             (ExtPrivkey *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),0);
  cfd::core::ExtPrivkey::operator=
            ((ExtPrivkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),(ExtPrivkey *)&gtest_ar_5.message_);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&gtest_ar_5.message_);
  cfd::core::Extkey::GetData
            (&local_580,
             (Extkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_568,&local_580);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_548,
             "\"0488ade405ae05dbb7000000006abdc0ea6ae90c728659358371f9e576271ab7c2f0113e9128fa8b64b05a5a3f00d77115d2a8d35623ed755a2dd7c5cfd95256f7266dd3e55e3d8790d9758fe77a\""
             ,"child1.GetData().GetHex().c_str()",
             "0488ade405ae05dbb7000000006abdc0ea6ae90c728659358371f9e576271ab7c2f0113e9128fa8b64b05a5a3f00d77115d2a8d35623ed755a2dd7c5cfd95256f7266dd3e55e3d8790d9758fe77a"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_568);
  cfd::core::ByteData::~ByteData(&local_580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_5c0,
             (Extkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5a0,
             "\"xprvA3hskUkqh1sEWhr726RLmGX7CwQ4jBHtY8ebnDijPhKNTiaCdBCdQe5UfvNFTZXwMm3vGktGpBWKZWCFbhQn5xYdHRPeaLpjCtVHSgoxS6E\""
             ,"child1.ToString().c_str()",
             "xprvA3hskUkqh1sEWhr726RLmGX7CwQ4jBHtY8ebnDijPhKNTiaCdBCdQe5UfvNFTZXwMm3vGktGpBWKZWCFbhQn5xYdHRPeaLpjCtVHSgoxS6E"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_5c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  local_5e1 = cfd::core::ExtPrivkey::IsValid
                        ((ExtPrivkey *)
                         ((long)&child2.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5e0,&local_5e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_5f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_5e0,
               (AssertionResult *)"child1.IsValid()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5f8,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper(&local_5f8);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  local_62c = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         ((long)&child2.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_628,"extprivkey_kVersionMainnetPrivkey","child1.GetVersion()",
             &extprivkey_kVersionMainnetPrivkey,&local_62c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_628);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_638);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
  local_654 = 5;
  local_655 = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         ((long)&child2.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_650,"5","child1.GetDepth()",&local_654,&local_655);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
  if (!bVar1) {
    testing::Message::Message(&local_660);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_650);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
  local_67c = 0;
  local_680 = cfd::core::Extkey::GetChildNum
                        ((Extkey *)
                         ((long)&child2.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  pcVar2 = (char *)0x0;
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_678,"0",(int *)"child1.GetChildNum()",&local_67c,&local_680);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              (&local_690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xae,pcVar3);
    testing::internal::AssertHelper::operator=(&local_690,&local_688);
    testing::internal::AssertHelper::~AssertHelper(&local_690);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  cfd::core::ExtPrivkey::DerivePrivkey
            ((ExtPrivkey *)&gtest_ar_10.message_,
             (ExtPrivkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),0x2c);
  cfd::core::ExtPrivkey::operator=
            ((ExtPrivkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ExtPrivkey *)&gtest_ar_10.message_);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&gtest_ar_10.message_);
  cfd::core::Extkey::GetData
            (&local_768,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_750,&local_768);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::GetData
            (&local_7a0,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_788,&local_7a0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_730,"child2.GetData().GetHex().c_str()",
             "child.GetData().GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_788);
  cfd::core::ByteData::~ByteData(&local_7a0);
  std::__cxx11::string::~string((string *)&local_750);
  cfd::core::ByteData::~ByteData(&local_768);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_7a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xb1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_7e0,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_800,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7c0,"child2.ToString().c_str()","child.ToString().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_7e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xb2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_808);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  local_821 = cfd::core::ExtPrivkey::IsValid
                        ((ExtPrivkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_820,&local_821,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar1) {
    testing::Message::Message(&local_830);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_820,
               (AssertionResult *)"child2.IsValid()","false","true",pcVar2);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xb3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_838,&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_838);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  local_86c = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_870 = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_868,"child2.GetVersion()","child.GetVersion()",&local_86c,
             &local_870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xb4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  local_891 = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_892 = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
            ((EqHelper<false> *)local_890,"child2.GetDepth()","child.GetDepth()",&local_891,
             &local_892);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_8a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xb5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_8a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  local_8bc = cfd::core::Extkey::GetChildNum
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_8c0 = cfd::core::Extkey::GetChildNum
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_8b8,"child2.GetChildNum()","child.GetChildNum()",&local_8bc,
             &local_8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar1) {
    testing::Message::Message(&local_8c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_8d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xb6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8d0,&local_8c8);
    testing::internal::AssertHelper::~AssertHelper(&local_8d0);
    testing::Message::~Message(&local_8c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_980,"0/44",(allocator *)((long)&gtest_ar_15.message_.ptr_ + 7));
  cfd::core::ExtPrivkey::DerivePrivkey
            (&local_960,
             (ExtPrivkey *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),&local_980);
  cfd::core::ExtPrivkey::operator=
            ((ExtPrivkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_960);
  cfd::core::ExtPrivkey::~ExtPrivkey(&local_960);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_15.message_.ptr_ + 7));
  cfd::core::Extkey::GetData
            (&local_9d0,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_9b8,&local_9d0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::GetData
            (&local_a08,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_9f0,&local_a08);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_998,"child2.GetData().GetHex().c_str()",
             "child.GetData().GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_9f0);
  cfd::core::ByteData::~ByteData(&local_a08);
  std::__cxx11::string::~string((string *)&local_9b8);
  cfd::core::ByteData::~ByteData(&local_9d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_998);
  if (!bVar1) {
    testing::Message::Message(&local_a10);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_998);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xb9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_a10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_a10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_998);
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_a48,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_a68,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a28,"child2.ToString().c_str()","child.ToString().c_str()",pcVar3,
             pcVar4);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
  if (!bVar1) {
    testing::Message::Message(&local_a70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xba,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_a70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
  local_a89 = cfd::core::ExtPrivkey::IsValid
                        ((ExtPrivkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a88,&local_a89,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar1) {
    testing::Message::Message(&local_a98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_17.message_,(internal *)local_a88,
               (AssertionResult *)"child2.IsValid()","false","true",pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_aa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xbb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_aa0,&local_a98);
    testing::internal::AssertHelper::~AssertHelper(&local_aa0);
    std::__cxx11::string::~string((string *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  local_ad4 = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_ad8 = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_ad0,"child2.GetVersion()","child.GetVersion()",&local_ad4,
             &local_ad8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
  if (!bVar1) {
    testing::Message::Message(&local_ae0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ad0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_ae0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_ae0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
  local_af9 = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_afa = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
            ((EqHelper<false> *)local_af8,"child2.GetDepth()","child.GetDepth()",&local_af9,
             &local_afa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af8);
  if (!bVar1) {
    testing::Message::Message(&local_b08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_af8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_b08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_b08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af8);
  local_b24 = cfd::core::Extkey::GetChildNum
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b28 = cfd::core::Extkey::GetChildNum
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_b20,"child2.GetChildNum()","child.GetChildNum()",&local_b24,
             &local_b28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b20);
  if (!bVar1) {
    testing::Message::Message(&local_b30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_b30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_b30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b20);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff4c0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff4c0);
  if (bVar1) {
    local_b41 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_bf8,"m/0/44",(allocator *)((long)&anon_var_0 + 7));
      cfd::core::ExtPrivkey::DerivePrivkey
                (&local_bd8,
                 (ExtPrivkey *)
                 ((long)&child.super_Extkey.tweak_sum_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 0x10),&local_bf8);
      cfd::core::ExtPrivkey::operator=
                ((ExtPrivkey *)
                 &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_bd8);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_bd8);
      std::__cxx11::string::~string((string *)&local_bf8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_b41 & 1) != 0) goto LAB_0030df52;
    pcStack_b40 = 
    "Expected: (child2 = extkey.DerivePrivkey(\"m/0/44\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_c10);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)
             &data1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
             ,0xc0,pcStack_b40);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)
             &data1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_c10);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             &data1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::Message::~Message(local_c10);
LAB_0030df52:
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_dc0,"0/44",(allocator *)((long)&gtest_ar_20.message_.ptr_ + 7));
  cfd::core::ExtPrivkey::DerivePrivkeyData
            ((KeyData *)local_da0,
             (ExtPrivkey *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),&local_dc0);
  std::__cxx11::string::~string((string *)&local_dc0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_20.message_.ptr_ + 7));
  cfd::core::KeyData::ToString_abi_cxx11_(&local_df8,(KeyData *)local_da0,false,kApostrophe,false);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_dd8,
             "\"[ae05dbb7/0/44]xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN\""
             ,"data1.ToString(false).c_str()",
             "[ae05dbb7/0/44]xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_df8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
  if (!bVar1) {
    testing::Message::Message(&local_e00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_dd8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_e00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_e00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
  cfd::core::KeyData::GetExtPrivkey((ExtPrivkey *)&local_ec8,(KeyData *)local_da0);
  cfd::core::Extkey::ToString_abi_cxx11_(&local_e38,&local_ec8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e18,
             "\"xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN\""
             ,"data1.GetExtPrivkey().ToString().c_str()",
             "xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_e38);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&local_ec8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e18);
  if (!bVar1) {
    testing::Message::Message(&local_ed0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &data2.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &data2.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_ed0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &data2.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_ed0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e18);
  cfd::core::ExtPrivkey::DerivePrivkeyData
            ((KeyData *)&gtest_ar_22.message_,
             (ExtPrivkey *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_1090,(KeyData *)&gtest_ar_22.message_,false,kApostrophe,false);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1070,
             "\"[ae05dbb7/0/44]xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN\""
             ,"data2.ToString(false).c_str()",
             "[ae05dbb7/0/44]xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_1090);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1070);
  if (!bVar1) {
    testing::Message::Message(&local_1098);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1070);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,200,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_1098);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_1098);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1070);
  cfd::core::KeyData::GetExtPrivkey((ExtPrivkey *)&local_1160,(KeyData *)&gtest_ar_22.message_);
  cfd::core::Extkey::ToString_abi_cxx11_(&local_10d0,&local_1160);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_10b0,
             "\"xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN\""
             ,"data2.GetExtPrivkey().ToString().c_str()",
             "xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_10d0);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&local_1160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b0);
  if (!bVar1) {
    testing::Message::Message(&local_1168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extprivkey.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1170,&local_1168);
    testing::internal::AssertHelper::~AssertHelper(&local_1170);
    testing::Message::~Message(&local_1168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b0);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar_22.message_);
  cfd::core::KeyData::~KeyData((KeyData *)local_da0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0);
  cfd::core::ExtPrivkey::~ExtPrivkey
            ((ExtPrivkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ExtPrivkey::~ExtPrivkey
            ((ExtPrivkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ExtPrivkey::~ExtPrivkey
            ((ExtPrivkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ExtPrivkey::~ExtPrivkey
            ((ExtPrivkey *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ExtPrivkey, DerivePrivkeyTest) {
  std::string ext_base58 = "xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV";
  ExtPrivkey extkey = ExtPrivkey(ext_base58);
  ExtPrivkey child;
  ExtPrivkey child1;
  ExtPrivkey child2;
  std::vector<uint32_t> path = {0, 44};

  child = extkey.DerivePrivkey(path);
  EXPECT_STREQ("0488ade40691fe4d290000002c368a8a370cc1f3e76cba08f13542e0dfb4e77dd08e8c70353f357a32b90be9d00005c52ec06dee7aa3249d9f8f3b930709967a43001fc8b9889eb22a850438ecc9", child.GetData().GetHex().c_str());
  EXPECT_STREQ("xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", child.ToString().c_str());
  EXPECT_TRUE(child.IsValid());
  EXPECT_EQ(extprivkey_kVersionMainnetPrivkey, child.GetVersion());
  EXPECT_EQ(6, child.GetDepth());
  EXPECT_EQ(44, child.GetChildNum());

  child1 = extkey.DerivePrivkey(0);
  EXPECT_STREQ("0488ade405ae05dbb7000000006abdc0ea6ae90c728659358371f9e576271ab7c2f0113e9128fa8b64b05a5a3f00d77115d2a8d35623ed755a2dd7c5cfd95256f7266dd3e55e3d8790d9758fe77a", child1.GetData().GetHex().c_str());
  EXPECT_STREQ("xprvA3hskUkqh1sEWhr726RLmGX7CwQ4jBHtY8ebnDijPhKNTiaCdBCdQe5UfvNFTZXwMm3vGktGpBWKZWCFbhQn5xYdHRPeaLpjCtVHSgoxS6E", child1.ToString().c_str());
  EXPECT_TRUE(child1.IsValid());
  EXPECT_EQ(extprivkey_kVersionMainnetPrivkey, child1.GetVersion());
  EXPECT_EQ(5, child1.GetDepth());
  EXPECT_EQ(0, child1.GetChildNum());

  child2 = child1.DerivePrivkey(44);
  EXPECT_STREQ(child2.GetData().GetHex().c_str(), child.GetData().GetHex().c_str());
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());
  EXPECT_EQ(child2.GetDepth(), child.GetDepth());
  EXPECT_EQ(child2.GetChildNum(), child.GetChildNum());

  child2 = extkey.DerivePrivkey("0/44");
  EXPECT_STREQ(child2.GetData().GetHex().c_str(), child.GetData().GetHex().c_str());
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());
  EXPECT_EQ(child2.GetDepth(), child.GetDepth());
  EXPECT_EQ(child2.GetChildNum(), child.GetChildNum());

  EXPECT_THROW((child2 = extkey.DerivePrivkey("m/0/44")), CfdException);

  // KeyData
  KeyData data1 = extkey.DerivePrivkeyData("0/44");
  EXPECT_STREQ("[ae05dbb7/0/44]xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", data1.ToString(false).c_str());
  EXPECT_STREQ("xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", data1.GetExtPrivkey().ToString().c_str());

  KeyData data2 = extkey.DerivePrivkeyData(path);
  EXPECT_STREQ("[ae05dbb7/0/44]xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", data2.ToString(false).c_str());
  EXPECT_STREQ("xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", data2.GetExtPrivkey().ToString().c_str());
}